

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O3

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
add_vertices_and_edges<__gnu_cxx::__normal_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>*,std::vector<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>>>>
          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this,
          __normal_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*,_std::vector<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>_>
          simplices_begin,
          __normal_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*,_std::vector<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>_>
          simplices_end)

{
  _Rb_tree_color _Var1;
  size_t sVar2;
  boost_vertex_handle *pbVar3;
  _Rb_tree_color _Var4;
  int iVar5;
  pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
  *e;
  boost_vertex_handle *pbVar6;
  vector<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
  edges;
  Vertex_handle local_6c;
  boost_vertex_handle *local_68;
  boost_vertex_handle *pbStack_60;
  long local_58;
  Edge_handle local_48;
  
  local_68 = (boost_vertex_handle *)0x0;
  pbStack_60 = (boost_vertex_handle *)0x0;
  local_58 = 0;
  if (simplices_begin._M_current == simplices_end._M_current) {
    _Var4 = ~_S_red;
  }
  else {
    _Var4 = ~_S_red;
    do {
      sVar2 = ((simplices_begin._M_current)->simplex_set)._M_t._M_impl.super__Rb_tree_header.
              _M_node_count;
      if ((int)sVar2 == 2) {
        if (sVar2 == 0) {
LAB_001269fb:
          __assert_fail("!empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/include/gudhi/Skeleton_blocker/Skeleton_blocker_simplex.h"
                        ,0xd3,
                        "T Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::first_vertex() const [T = Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle]"
                       );
        }
        local_48.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source._0_4_ =
             ((simplices_begin._M_current)->simplex_set)._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_left[1]._M_color;
        local_6c = Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                   ::last_vertex(simplices_begin._M_current);
        std::
        vector<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::allocator<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>>
        ::
        emplace_back<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                  ((vector<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::allocator<std::pair<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>>
                    *)&local_68,(Vertex_handle *)&local_48,&local_6c);
      }
      else if ((int)sVar2 == 1) {
        if (sVar2 == 0) goto LAB_001269fb;
        _Var1 = ((simplices_begin._M_current)->simplex_set)._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left[1]._M_color;
        if ((int)_Var4 <= (int)_Var1) {
          _Var4 = _Var1;
        }
      }
      simplices_begin._M_current = simplices_begin._M_current + 1;
    } while (simplices_begin._M_current != simplices_end._M_current);
  }
  iVar5 = _Var4 + _S_black;
  while (pbVar3 = pbStack_60, iVar5 = iVar5 + -1, -1 < iVar5) {
    add_vertex(this);
  }
  if (local_68 != pbStack_60) {
    pbVar6 = local_68;
    do {
      add_edge_without_blockers(&local_48,this,(Vertex_handle)*pbVar6,(Vertex_handle)pbVar6[1]);
      pbVar6 = pbVar6 + 2;
    } while (pbVar6 != pbVar3);
  }
  if (local_68 != (boost_vertex_handle *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  return;
}

Assistant:

void add_vertices_and_edges(SimpleHandleOutputIterator simplices_begin, SimpleHandleOutputIterator simplices_end) {
    std::vector<std::pair<Vertex_handle, Vertex_handle>> edges;
    // first pass to add vertices and edges
    int num_vertex = -1;
    for (auto s_it = simplices_begin; s_it != simplices_end; ++s_it) {
      if (s_it->dimension() == 0) num_vertex = (std::max)(num_vertex, s_it->first_vertex().vertex);
      if (s_it->dimension() == 1) edges.emplace_back(s_it->first_vertex(), s_it->last_vertex());
    }
    while (num_vertex-- >= 0) add_vertex();

    for (const auto& e : edges)
      add_edge_without_blockers(e.first, e.second);
  }